

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNWatc.cpp
# Opt level: O0

void __thiscall NaPNWatcher::action(NaPNWatcher *this)

{
  char *pcVar1;
  uint uVar2;
  NaVector *pNVar3;
  NaPetriNet *this_00;
  NaTimer *pNVar4;
  ulong uVar5;
  NaPetriNode *in_RDI;
  NaPetriCnInput *in_stack_ffffffffffffffe8;
  NaPetriCnInput *this_01;
  
  pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffe8);
  uVar2 = (*in_RDI->_vptr_NaPetriNode[0x16])(in_RDI,pNVar3);
  if (((uVar2 & 1) != 0) && (in_RDI[2]._vptr_NaPetriNode != (_func_int **)0x0)) {
    this_01 = (NaPetriCnInput *)in_RDI[2]._vptr_NaPetriNode;
    pcVar1 = in_RDI[2].szName;
    pNVar3 = NaPetriCnInput::data(this_01);
    this_00 = NaPetriNode::net(in_RDI);
    pNVar4 = NaPetriNet::timer(this_00);
    uVar5 = (*(code *)this_01)(pcVar1,pNVar3,pNVar4);
    if ((uVar5 & 1) == 0) {
      (*in_RDI->_vptr_NaPetriNode[5])();
    }
  }
  return;
}

Assistant:

void
NaPNWatcher::action ()
{
  if(watcher(events.data()))
    if(NULL != m_pExtFunc)
      if(!(*m_pExtFunc)(m_pUserData, events.data(), net()->timer()))
	halt();
}